

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StringConverter.cpp
# Opt level: O0

map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>_>_>
* __thiscall
cali::StringConverter::rec_dict_abi_cxx11_
          (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>_>_>
           *__return_storage_ptr__,StringConverter *this,bool *okptr)

{
  bool bVar1;
  char cVar2;
  byte bVar3;
  ulong uVar4;
  mapped_type *this_00;
  char *in_RCX;
  char in_R8B;
  bool local_2b2;
  StringConverter local_280;
  string local_260;
  string local_240;
  string local_220;
  undefined1 local_200 [8];
  string val;
  string key;
  char c;
  int d;
  istringstream local_1a8 [8];
  istringstream is;
  byte local_22;
  bool error;
  bool *okptr_local;
  StringConverter *this_local;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>_>_>
  *ret;
  
  bVar1 = false;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>_>_>
  ::map(__return_storage_ptr__);
  local_22 = 0;
  std::__cxx11::istringstream::istringstream(local_1a8,(string *)this,_S_in);
  cVar2 = util::read_char((istream *)local_1a8);
  if (cVar2 == '{') {
    do {
      util::read_word_abi_cxx11_
                ((string *)((long)&val.field_2 + 8),(util *)local_1a8,(istream *)0x48d9e6,in_RCX);
      key.field_2._M_local_buf[0xf] = util::read_char((istream *)local_1a8);
      if (key.field_2._M_local_buf[0xf] == ':') {
        std::__cxx11::string::string((string *)local_200);
        cVar2 = util::read_char((istream *)local_1a8);
        if (cVar2 == '{') {
          std::__cxx11::string::operator=((string *)local_200,"{");
          in_RCX = (char *)0x0;
          util::read_nested_text_abi_cxx11_(&local_220,(util *)local_1a8,(istream *)0x7b,'}',in_R8B)
          ;
          std::__cxx11::string::append((string *)local_200);
          std::__cxx11::string::~string((string *)&local_220);
          key.field_2._M_local_buf[0xf] = util::read_char((istream *)local_1a8);
          if (key.field_2._M_local_buf[0xf] == '}') {
            std::__cxx11::string::append(local_200);
            goto LAB_003206cf;
          }
          local_22 = 1;
          key.field_2._8_4_ = 2;
        }
        else {
          if (cVar2 == '[') {
            std::__cxx11::string::operator=((string *)local_200,"[");
            in_RCX = (char *)0x0;
            util::read_nested_text_abi_cxx11_
                      (&local_240,(util *)local_1a8,(istream *)0x5b,']',in_R8B);
            std::__cxx11::string::append((string *)local_200);
            std::__cxx11::string::~string((string *)&local_240);
            key.field_2._M_local_buf[0xf] = util::read_char((istream *)local_1a8);
            if (key.field_2._M_local_buf[0xf] != ']') {
              local_22 = 1;
              key.field_2._8_4_ = 2;
              goto LAB_0032077e;
            }
            std::__cxx11::string::append(local_200);
          }
          else {
            std::istream::unget();
            util::read_word_abi_cxx11_(&local_260,(util *)local_1a8,(istream *)",}",in_RCX);
            std::__cxx11::string::operator=((string *)local_200,(string *)&local_260);
            std::__cxx11::string::~string((string *)&local_260);
          }
LAB_003206cf:
          uVar4 = std::__cxx11::string::empty();
          if ((uVar4 & 1) == 0) {
            StringConverter(&local_280,(string *)local_200);
            this_00 = std::
                      map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>_>_>
                      ::operator[](__return_storage_ptr__,(key_type *)((long)&val.field_2 + 8));
            operator=(this_00,&local_280);
            ~StringConverter(&local_280);
          }
          key.field_2._M_local_buf[0xf] = util::read_char((istream *)local_1a8);
          key.field_2._8_4_ = 0;
        }
LAB_0032077e:
        std::__cxx11::string::~string((string *)local_200);
      }
      else {
        if (okptr != (bool *)0x0) {
          *okptr = false;
        }
        bVar1 = true;
        key.field_2._8_4_ = 1;
      }
      std::__cxx11::string::~string((string *)(val.field_2._M_local_buf + 8));
      if (key.field_2._8_4_ != 0) {
        if (key.field_2._8_4_ != 2) goto LAB_0032087b;
        break;
      }
      bVar3 = std::ios::good();
      in_RCX = (char *)CONCAT71((int7)((ulong)in_RCX >> 8),bVar3);
      local_2b2 = (bVar3 & 1) != 0 && key.field_2._M_local_buf[0xf] == ',';
    } while (local_2b2);
    if (key.field_2._M_local_buf[0xf] != '}') {
      local_22 = 1;
    }
    if (okptr != (bool *)0x0) {
      *okptr = (bool)((local_22 ^ 0xff) & 1);
    }
    bVar1 = true;
  }
  else {
    std::istream::unget();
    if (okptr != (bool *)0x0) {
      *okptr = false;
    }
    bVar1 = true;
  }
LAB_0032087b:
  std::__cxx11::istringstream::~istringstream(local_1a8);
  if (!bVar1) {
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cali::StringConverter>_>_>
    ::~map(__return_storage_ptr__);
  }
  return __return_storage_ptr__;
}

Assistant:

std::map<std::string, cali::StringConverter> cali::StringConverter::rec_dict(bool* okptr) const
{
    std::map<std::string, StringConverter> ret;
    bool                                   error = false;

    std::istringstream is(m_str);

    int  d = 0;
    char c = util::read_char(is);

    if (c == '{')
        ++d;
    else {
        is.unget();
        if (okptr)
            *okptr = false;
        return ret;
    }

    do {
        std::string key = util::read_word(is, ":");
        c               = util::read_char(is);

        if (c != ':') {
            if (okptr)
                *okptr = false;
            return ret;
        }

        std::string val;
        c = util::read_char(is);

        if (c == '{') {
            val = "{";
            val.append(util::read_nested_text(is, '{', '}'));

            c = util::read_char(is);
            if (c != '}') {
                error = true;
                break;
            }
            val.append("}");
        } else if (c == '[') {
            val = "[";
            val.append(util::read_nested_text(is, '[', ']'));

            c = util::read_char(is);
            if (c != ']') {
                error = true;
                break;
            }
            val.append("]");
        } else {
            is.unget();
            val = util::read_word(is, ",}");
        }

        if (!key.empty())
            ret[key] = StringConverter(val);

        c = util::read_char(is);
    } while (is.good() && c == ',');

    if (d > 0) {
        if (c != '}')
            error = true;
    } else
        is.unget();

    if (okptr)
        *okptr = !error;

    return ret;
}